

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

bool duckdb::FinalizeSingleThreaded(HashJoinGlobalSinkState *sink,bool consider_skew)

{
  bool bVar1;
  type this;
  idx_t iVar2;
  
  bVar1 = true;
  if (sink->num_threads != 1) {
    if ((sink->context->config).verify_parallelism == false) {
      this = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
             operator*(&sink->hash_table);
      iVar2 = JoinHashTable::Count(this);
      if (consider_skew && iVar2 >= 0x100000) {
        bVar1 = KeysAreSkewed(sink);
        return bVar1;
      }
      bVar1 = iVar2 < 0x100000 || consider_skew;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

static bool FinalizeSingleThreaded(const HashJoinGlobalSinkState &sink, const bool consider_skew) {

	// if only one thread, finalize single-threaded
	const auto num_threads = NumericCast<idx_t>(sink.num_threads);
	if (num_threads == 1) {
		return true;
	}

	// if we want to verify parallelism, finalize parallel
	if (sink.context.config.verify_parallelism) {
		return false;
	}

	// finalize single-threaded if we have less than 1M rows
	const auto &ht = *sink.hash_table;
	const bool ht_is_small = ht.Count() < PARALLEL_CONSTRUCT_THRESHOLD;

	if (consider_skew) {
		return ht_is_small || KeysAreSkewed(sink);
	}
	return ht_is_small;
}